

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O0

QByteArray * __thiscall
QDefaultItemEditorFactory::valuePropertyName(QDefaultItemEditorFactory *this,int userType)

{
  undefined4 in_EDX;
  QByteArray *in_RDI;
  
  switch(in_EDX) {
  case 1:
    QByteArray::QByteArray(in_RDI,"currentIndex",-1);
    break;
  case 2:
  case 3:
  case 6:
    QByteArray::QByteArray(in_RDI,"value",-1);
    break;
  case 10:
  default:
    QByteArray::QByteArray(in_RDI,"text",-1);
    break;
  case 0xe:
    QByteArray::QByteArray(in_RDI,"date",-1);
    break;
  case 0xf:
    QByteArray::QByteArray(in_RDI,"time",-1);
    break;
  case 0x10:
    QByteArray::QByteArray(in_RDI,"dateTime",-1);
  }
  return in_RDI;
}

Assistant:

QByteArray QDefaultItemEditorFactory::valuePropertyName(int userType) const
{
    switch (userType) {
#if QT_CONFIG(combobox)
    case QMetaType::Bool:
        return "currentIndex";
#endif
#if QT_CONFIG(spinbox)
    case QMetaType::UInt:
    case QMetaType::Int:
    case QMetaType::Double:
        return "value";
#endif
#if QT_CONFIG(datetimeedit)
    case QMetaType::QDate:
        return "date";
    case QMetaType::QTime:
        return "time";
    case QMetaType::QDateTime:
        return "dateTime";
#endif
    case QMetaType::QString:
    default:
        // the default editor is a lineedit
        return "text";
    }
}